

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::ENUM(Value *__return_storage_ptr__,uint64_t value,LogicalType *original_type)

{
  PhysicalType PVar1;
  uchar uVar2;
  unsigned_short uVar3;
  uint uVar4;
  InternalException *this;
  string local_60;
  LogicalType local_40;
  
  LogicalType::LogicalType(&local_40,original_type);
  Value(__return_storage_ptr__,&local_40);
  LogicalType::~LogicalType(&local_40);
  PVar1 = original_type->physical_type_;
  if (PVar1 == UINT8) {
    uVar2 = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(value);
    (__return_storage_ptr__->value_).utinyint = uVar2;
  }
  else if (PVar1 == UINT16) {
    uVar3 = NumericCastImpl<unsigned_short,_unsigned_long,_false>::Convert(value);
    (__return_storage_ptr__->value_).usmallint = uVar3;
  }
  else {
    if (PVar1 != UINT32) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Incorrect Physical Type for ENUM","");
      InternalException::InternalException(this,&local_60);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(value);
    (__return_storage_ptr__->value_).uinteger = uVar4;
  }
  __return_storage_ptr__->is_null = false;
  return __return_storage_ptr__;
}

Assistant:

Value Value::ENUM(uint64_t value, const LogicalType &original_type) {
	D_ASSERT(original_type.id() == LogicalTypeId::ENUM);
	Value result(original_type);
	switch (original_type.InternalType()) {
	case PhysicalType::UINT8:
		result.value_.utinyint = NumericCast<uint8_t>(value);
		break;
	case PhysicalType::UINT16:
		result.value_.usmallint = NumericCast<uint16_t>(value);
		break;
	case PhysicalType::UINT32:
		result.value_.uinteger = NumericCast<uint32_t>(value);
		break;
	default:
		throw InternalException("Incorrect Physical Type for ENUM");
	}
	result.is_null = false;
	return result;
}